

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_line_reader.c
# Opt level: O0

int LoadMore(StackLineReader *reader)

{
  int iVar1;
  long in_RDI;
  int read;
  size_t size_to_read;
  char *ptr;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  iVar1 = CpuFeatures_ReadFile
                    ((int)((ulong)(in_RDI + *(long *)(in_RDI + 0x408)) >> 0x20),
                     (void *)(0x400 - *(long *)(in_RDI + 0x408)),
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  *(long *)(in_RDI + 0x408) = (long)iVar1 + *(long *)(in_RDI + 0x408);
  return iVar1;
}

Assistant:

static int LoadMore(StackLineReader* reader) {
  char* const ptr = reader->buffer + reader->view.size;
  const size_t size_to_read = STACK_LINE_READER_BUFFER_SIZE - reader->view.size;
  const int read = CpuFeatures_ReadFile(reader->fd, ptr, size_to_read);
  assert(read >= 0);
  assert(read <= (int)size_to_read);
  reader->view.size += read;
  return read;
}